

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionSquare<double,_1>::EigenDecompositionSquare
          (EigenDecompositionSquare<double,_1> *this,int decompositionCount,int stateCount,
          int categoryCount,long flags)

{
  double **ppdVar1;
  double *pdVar2;
  undefined8 *puVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  
  (this->super_EigenDecomposition<double,_1>).kEigenDecompCount = decompositionCount;
  (this->super_EigenDecomposition<double,_1>).kStateCount = stateCount;
  (this->super_EigenDecomposition<double,_1>).kCategoryCount = categoryCount;
  (this->super_EigenDecomposition<double,_1>).kFlags = flags;
  uVar4 = ((uint)flags & 0x20) >> 5;
  sVar7 = (long)decompositionCount << 3;
  iVar5 = stateCount << uVar4;
  (this->super_EigenDecomposition<double,_1>)._vptr_EigenDecomposition =
       (_func_int **)&PTR__EigenDecompositionSquare_001574c0;
  this->isComplex = SUB41(uVar4,0);
  this->kEigenValuesSize = iVar5;
  ppdVar1 = (double **)malloc(sVar7);
  (this->super_EigenDecomposition<double,_1>).gEigenValues = ppdVar1;
  if (ppdVar1 != (double **)0x0) {
    ppdVar1 = (double **)malloc(sVar7);
    this->gEMatrices = ppdVar1;
    if (ppdVar1 != (double **)0x0) {
      ppdVar1 = (double **)malloc(sVar7);
      this->gIMatrices = ppdVar1;
      if (ppdVar1 != (double **)0x0) {
        uVar6 = 0;
        sVar7 = (long)stateCount * (long)stateCount * 8;
        do {
          pdVar2 = (double *)malloc(sVar7);
          if ((uint)(~(decompositionCount >> 0x1f) & decompositionCount) == uVar6) {
            (this->super_EigenDecomposition<double,_1>).matrixTmp = pdVar2;
            return;
          }
          this->gEMatrices[uVar6] = pdVar2;
          if (this->gEMatrices[uVar6] == (double *)0x0) break;
          pdVar2 = (double *)malloc(sVar7);
          this->gIMatrices[uVar6] = pdVar2;
          if (this->gIMatrices[uVar6] == (double *)0x0) break;
          pdVar2 = (double *)malloc((long)iVar5 << 3);
          (this->super_EigenDecomposition<double,_1>).gEigenValues[uVar6] = pdVar2;
          ppdVar1 = (this->super_EigenDecomposition<double,_1>).gEigenValues + uVar6;
          uVar6 = uVar6 + 1;
        } while (*ppdVar1 != (double *)0x0);
      }
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = __cxa_init_primary_exception;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::EigenDecompositionSquare(int decompositionCount,
											       int stateCount,
											       int categoryCount,
											       long flags)
	: EigenDecomposition<BEAGLE_CPU_EIGEN_GENERIC>(decompositionCount,stateCount,categoryCount, flags) {

	isComplex = kFlags & BEAGLE_FLAG_EIGEN_COMPLEX;

	if (isComplex)
		kEigenValuesSize = 2 * kStateCount;
	else
		kEigenValuesSize = kStateCount;

    this->gEigenValues = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
    if (gEigenValues == NULL)
        throw std::bad_alloc();

    gEMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
    if (gEMatrices == NULL)
    	throw std::bad_alloc();

    gIMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
       if (gIMatrices == NULL)
       	throw std::bad_alloc();

    for (int i = 0; i < kEigenDecompCount; i++) {
    	gEMatrices[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount * kStateCount);
    	if (gEMatrices[i] == NULL)
    		throw std::bad_alloc();

    	gIMatrices[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount * kStateCount);
    	if (gIMatrices[i] == NULL)
    		throw std::bad_alloc();

    	gEigenValues[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kEigenValuesSize);
    	if (gEigenValues[i] == NULL)
    		throw std::bad_alloc();
    }

    matrixTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount * kStateCount);
}